

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O0

void failure_rate_binary_fuse16(void)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  void *__ptr;
  size_t i;
  size_t trial;
  size_t total_trials;
  size_t failure;
  binary_fuse16_t filter;
  uint64_t *big_set;
  size_t size;
  binary_fuse16_t *in_stack_00000088;
  uint32_t in_stack_00000094;
  uint64_t *in_stack_00000098;
  ulong local_58;
  ulong local_50;
  long local_40;
  binary_fuse16_t *in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffd4;
  
  printf("testing binary fuse16 for failure rate\n");
  __ptr = malloc(40000);
  binary_fuse16_allocate(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  local_40 = 0;
  for (local_50 = 0; local_50 < 0x3e9; local_50 = local_50 + 1) {
    for (local_58 = 0; local_58 < 5000; local_58 = local_58 + 1) {
      iVar2 = rand();
      iVar3 = rand();
      *(long *)((long)__ptr + local_58 * 8) = (long)iVar2 + ((long)iVar3 << 0x20);
    }
    _Var1 = binary_fuse16_populate(in_stack_00000098,in_stack_00000094,in_stack_00000088);
    if (!_Var1) {
      local_40 = local_40 + 1;
    }
  }
  printf("failures %zu out of %zu\n\n",local_40,1000000);
  binary_fuse16_free((binary_fuse16_t *)0x10a72a);
  free(__ptr);
  return;
}

Assistant:

void failure_rate_binary_fuse16() {
  printf("testing binary fuse16 for failure rate\n");
  // we construct many 5000-long input cases and check the probability of failure.
  size_t size = 5000;
  uint64_t *big_set = (uint64_t *)malloc(sizeof(uint64_t) * size);
  binary_fuse16_t filter;
  binary_fuse16_allocate((uint32_t)size, &filter);
  size_t failure = 0;
  size_t total_trials = 1000000;

  for(size_t trial = 0; trial <= 1000; trial++) {
    for (size_t i = 0; i < size; i++) {
      big_set[i] = (uint64_t)rand() + (((uint64_t) rand()) << 32U);
    }
    if(!binary_fuse16_populate(big_set, (uint32_t)size, &filter)) {
      failure++;
    }
  }
  printf("failures %zu out of %zu\n\n", failure, total_trials);
  binary_fuse16_free(&filter);
  free(big_set);
}